

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int ipc_helper_send_zero(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_18 [16];
  
  local_18 = uv_buf_init(0,0);
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&channel,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_pipe_open(&channel,0);
    eval_a = 1;
    iVar1 = uv_is_readable(&channel);
    eval_b = (int64_t)iVar1;
    if (eval_b == 1) {
      eval_a = 1;
      iVar1 = uv_is_writable(&channel);
      eval_b = (int64_t)iVar1;
      if (eval_b == 1) {
        iVar1 = uv_is_closing(&channel);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_write(&write_req,&channel,local_18,1,send_zero_write_cb);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = (int64_t)send_zero_write;
              if (eval_b == 1) {
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                eval_a = 0;
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(uv_default_loop())";
                pcVar3 = "0";
                uVar2 = 0x35a;
              }
              else {
                pcVar4 = "send_zero_write";
                pcVar3 = "1";
                uVar2 = 0x358;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x356;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar2 = 0x353;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_is_closing((uv_handle_t*) &channel)";
          uVar2 = 0x34b;
        }
      }
      else {
        pcVar4 = "uv_is_writable((uv_stream_t*) &channel)";
        pcVar3 = "1";
        uVar2 = 0x34a;
      }
    }
    else {
      pcVar4 = "uv_is_readable((uv_stream_t*) &channel)";
      pcVar3 = "1";
      uVar2 = 0x349;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x345;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

int ipc_helper_send_zero(void) {
  int r;
  uv_buf_t zero_buf;

  zero_buf = uv_buf_init(0, 0);

  r = uv_pipe_init(uv_default_loop(), &channel, 0);
  ASSERT_OK(r);

  uv_pipe_open(&channel, UV_STDIN_FD);

  ASSERT_EQ(1, uv_is_readable((uv_stream_t*) &channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*) &channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &channel));

  r = uv_write(&write_req,
               (uv_stream_t*)&channel,
               &zero_buf,
               1,
               send_zero_write_cb);

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, send_zero_write);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}